

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * cmsys::SystemTools::CollapseFullPath
                   (string *__return_storage_ptr__,string *in_path,char *in_base)

{
  char *__s;
  allocator<char> local_859;
  string local_858;
  char *local_838;
  char *cwd;
  char *res_in_base;
  char buf [2048];
  char *in_base_local;
  string *in_path_local;
  
  cwd = in_base;
  if ((in_base == (char *)0x0) &&
     (local_838 = Getcwd((char *)&res_in_base,0x800), cwd = local_838, local_838 == (char *)0x0)) {
    cwd = "";
  }
  __s = cwd;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_858,__s,&local_859);
  CollapseFullPath(__return_storage_ptr__,in_path,&local_858);
  std::__cxx11::string::~string((string *)&local_858);
  std::allocator<char>::~allocator(&local_859);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::CollapseFullPath(const std::string& in_path,
                                          const char* in_base)
{
  // Use the current working directory as a base path.
  char buf[2048];
  const char* res_in_base = in_base;
  if (!res_in_base) {
    if (const char* cwd = Getcwd(buf, 2048)) {
      res_in_base = cwd;
    } else {
      res_in_base = "";
    }
  }

  return SystemTools::CollapseFullPath(in_path, std::string(res_in_base));
}